

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O1

void __thiscall
Corrade::Utility::Arguments::Entry::Entry
          (Entry *this,Type type,char shortKey,string *key,string *helpKey,string *defaultValue,
          size_t id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 *puVar3;
  char cVar4;
  pointer pcVar5;
  undefined8 uVar6;
  long lVar7;
  undefined8 *puVar8;
  long lVar9;
  char cVar10;
  ulong uVar11;
  __string_type __str;
  ulong *local_c0;
  long local_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  undefined8 uStack_a8;
  ulong *local_a0;
  ulong local_98;
  ulong local_90 [2];
  string *local_80;
  ulong *local_78;
  long local_70;
  ulong local_68;
  undefined8 uStack_60;
  undefined8 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  this->type = type;
  this->shortKey = shortKey;
  paVar1 = &(this->key).field_2;
  (this->key)._M_dataplus._M_p = (pointer)paVar1;
  pcVar5 = (key->_M_dataplus)._M_p;
  paVar2 = &key->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar2) {
    uVar6 = *(undefined8 *)((long)&key->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->key).field_2 + 8) = uVar6;
  }
  else {
    (this->key)._M_dataplus._M_p = pcVar5;
    (this->key).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->key)._M_string_length = key->_M_string_length;
  (key->_M_dataplus)._M_p = (pointer)paVar2;
  key->_M_string_length = 0;
  (key->field_2)._M_local_buf[0] = '\0';
  local_38 = &(this->help).field_2;
  (this->help)._M_dataplus._M_p = (pointer)local_38;
  (this->help)._M_string_length = 0;
  (this->help).field_2._M_local_buf[0] = '\0';
  (this->helpKey)._M_dataplus._M_p = (pointer)&(this->helpKey).field_2;
  (this->helpKey)._M_string_length = 0;
  (this->helpKey).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->defaultValue).field_2;
  (this->defaultValue)._M_dataplus._M_p = (pointer)paVar1;
  pcVar5 = (defaultValue->_M_dataplus)._M_p;
  paVar2 = &defaultValue->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar2) {
    uVar6 = *(undefined8 *)((long)&defaultValue->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->defaultValue).field_2 + 8) = uVar6;
  }
  else {
    (this->defaultValue)._M_dataplus._M_p = pcVar5;
    (this->defaultValue).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_80 = (string *)&this->helpKey;
  (this->defaultValue)._M_string_length = defaultValue->_M_string_length;
  (defaultValue->_M_dataplus)._M_p = (pointer)paVar2;
  defaultValue->_M_string_length = 0;
  (defaultValue->field_2)._M_local_buf[0] = '\0';
  (this->environment)._M_dataplus._M_p = (pointer)&(this->environment).field_2;
  (this->environment)._M_string_length = 0;
  (this->environment).field_2._M_local_buf[0] = '\0';
  this->id = id;
  if (2 < (byte)(type - NamedArgument)) {
    std::__cxx11::string::operator=(local_80,(string *)helpKey);
    return;
  }
  local_a0 = local_90;
  pcVar5 = (this->key)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar5,pcVar5 + (this->key)._M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_a0,local_98,0,'\x01');
  local_c0 = (ulong *)&local_b0;
  pcVar5 = (helpKey->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar5,pcVar5 + helpKey->_M_string_length);
  lVar7 = local_b8;
  if (local_b8 != 0) {
    lVar9 = 0;
    do {
      cVar4 = *(char *)((long)local_c0 + lVar9);
      if ((byte)(cVar4 + 0x9fU) < 0x1a) {
        cVar10 = cVar4 + -0x20;
LAB_00122c8b:
        *(char *)((long)local_c0 + lVar9) = cVar10;
      }
      else {
        cVar10 = '_';
        if (cVar4 == '-') goto LAB_00122c8b;
      }
      lVar9 = lVar9 + 1;
    } while (local_b8 != lVar9);
  }
  if (local_c0 == (ulong *)&local_b0) {
    uStack_60 = uStack_a8;
    local_78 = &local_68;
  }
  else {
    local_78 = local_c0;
  }
  local_68 = CONCAT71(uStack_af,local_b0);
  local_70 = local_b8;
  local_b8 = 0;
  local_b0 = 0;
  uVar11 = 0xf;
  if (local_a0 != local_90) {
    uVar11 = local_90[0];
  }
  local_c0 = (ulong *)&local_b0;
  if (uVar11 < local_98 + lVar7) {
    uVar11 = 0xf;
    if (local_78 != &local_68) {
      uVar11 = local_68;
    }
    if (local_98 + lVar7 <= uVar11) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_a0);
      goto LAB_00122d59;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_78);
LAB_00122d59:
  local_58 = &local_48;
  puVar3 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar3) {
    local_48 = *puVar3;
    uStack_40 = puVar8[3];
  }
  else {
    local_48 = *puVar3;
    local_58 = (undefined8 *)*puVar8;
  }
  local_50 = puVar8[1];
  *puVar8 = puVar3;
  puVar8[1] = 0;
  *(undefined1 *)puVar3 = 0;
  std::__cxx11::string::operator=(local_80,(string *)&local_58);
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if (local_c0 != (ulong *)&local_b0) {
    operator_delete(local_c0);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  return;
}

Assistant:

Arguments::Entry::Entry(Type type, char shortKey, std::string key, std::string helpKey, std::string defaultValue, std::size_t id): type(type), shortKey(shortKey), key(std::move(key)), defaultValue(std::move(defaultValue)), id(id) {
    if(type == Type::NamedArgument || type == Type::Option || type == Type::ArrayOption)
        this->helpKey = this->key + ' ' + uppercaseKey(helpKey);
    else this->helpKey = std::move(helpKey);
}